

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O0

hts_idx_t * hts_idx_init(int n,int fmt,uint64_t offset0,int min_shift,int n_lvls)

{
  bidx_t **ppbVar1;
  lidx_t *plVar2;
  hts_idx_t *idx;
  int n_lvls_local;
  int min_shift_local;
  uint64_t offset0_local;
  int fmt_local;
  int n_local;
  
  _fmt_local = (hts_idx_t *)calloc(1,0x88);
  if (_fmt_local == (hts_idx_t *)0x0) {
    _fmt_local = (hts_idx_t *)0x0;
  }
  else {
    _fmt_local->fmt = fmt;
    _fmt_local->min_shift = min_shift;
    _fmt_local->n_lvls = n_lvls;
    _fmt_local->n_bins = ((1 << ((char)n_lvls * '\x03' + 3U & 0x1f)) + -1) / 7;
    (_fmt_local->z).last_bin = 0xffffffff;
    (_fmt_local->z).last_tid = -1;
    (_fmt_local->z).save_tid = -1;
    (_fmt_local->z).save_bin = 0xffffffff;
    (_fmt_local->z).off_end = offset0;
    (_fmt_local->z).off_beg = offset0;
    (_fmt_local->z).last_off = offset0;
    (_fmt_local->z).save_off = offset0;
    (_fmt_local->z).last_coor = -1;
    if (n != 0) {
      _fmt_local->m = n;
      _fmt_local->n = n;
      ppbVar1 = (bidx_t **)calloc((long)n,8);
      _fmt_local->bidx = ppbVar1;
      if (_fmt_local->bidx == (bidx_t **)0x0) {
        free(_fmt_local);
        _fmt_local = (hts_idx_t *)0x0;
      }
      else {
        plVar2 = (lidx_t *)calloc((long)n,0x10);
        _fmt_local->lidx = plVar2;
        if (_fmt_local->lidx == (lidx_t *)0x0) {
          free(_fmt_local->bidx);
          free(_fmt_local);
          _fmt_local = (hts_idx_t *)0x0;
        }
      }
    }
  }
  return _fmt_local;
}

Assistant:

hts_idx_t *hts_idx_init(int n, int fmt, uint64_t offset0, int min_shift, int n_lvls)
{
    hts_idx_t *idx;
    idx = (hts_idx_t*)calloc(1, sizeof(hts_idx_t));
    if (idx == NULL) return NULL;
    idx->fmt = fmt;
    idx->min_shift = min_shift;
    idx->n_lvls = n_lvls;
    idx->n_bins = ((1<<(3 * n_lvls + 3)) - 1) / 7;
    idx->z.save_bin = idx->z.save_tid = idx->z.last_tid = idx->z.last_bin = 0xffffffffu;
    idx->z.save_off = idx->z.last_off = idx->z.off_beg = idx->z.off_end = offset0;
    idx->z.last_coor = 0xffffffffu;
    if (n) {
        idx->n = idx->m = n;
        idx->bidx = (bidx_t**)calloc(n, sizeof(bidx_t*));
        if (idx->bidx == NULL) { free(idx); return NULL; }
        idx->lidx = (lidx_t*) calloc(n, sizeof(lidx_t));
        if (idx->lidx == NULL) { free(idx->bidx); free(idx); return NULL; }
    }
    return idx;
}